

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::PrintBuffer(PF_BufferMgr *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Buffer contains ",0x10);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->numPages);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," pages of size ",0xf);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->pageSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Contents in order from most recently used to ",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"least recently used.\n",0x15);
  iVar2 = this->first;
  while (iVar2 != -1) {
    iVar1 = this->bufTable[iVar2].next;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," :: \n",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  fd = ",7);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->bufTable[iVar2].fd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  pageNum = ",0xc);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->bufTable[iVar2].pageNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  bDirty = ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->bufTable[iVar2].bDirty);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  pinCount = ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->bufTable[iVar2].pinCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    iVar2 = iVar1;
  }
  if (this->first == -1) {
    pcVar5 = "Buffer is empty!\n";
    lVar4 = 0x11;
  }
  else {
    pcVar5 = "All remaining slots are free.\n";
    lVar4 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  return 0;
}

Assistant:

RC PF_BufferMgr::PrintBuffer()
{
   cout << "Buffer contains " << numPages << " pages of size "
      << pageSize <<".\n";
   cout << "Contents in order from most recently used to "
      << "least recently used.\n";

   int slot, next;
   slot = first;
   while (slot != INVALID_SLOT) {
      next = bufTable[slot].next;
      cout << slot << " :: \n";
      cout << "  fd = " << bufTable[slot].fd << "\n";
      cout << "  pageNum = " << bufTable[slot].pageNum << "\n";
      cout << "  bDirty = " << bufTable[slot].bDirty << "\n";
      cout << "  pinCount = " << bufTable[slot].pinCount << "\n";
      slot = next;
   }

   if (first==INVALID_SLOT)
      cout << "Buffer is empty!\n";
   else
      cout << "All remaining slots are free.\n";

   return 0;
}